

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getLocalFromIdx
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,uint32_t idx)

{
  size_t sVar1;
  string *this_00;
  string local_90;
  string local_70;
  Err local_50;
  allocator<char> local_29;
  
  if (this->func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"cannot access locals outside of a function",&local_29);
    Lexer::err(&local_50,&this->in,&local_90);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_90;
  }
  else {
    sVar1 = Function::getNumLocals(this->func);
    if (idx < sVar1) {
      *(uint32_t *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = idx;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"local index out of bounds",&local_29);
    Lexer::err(&local_50,&this->in,&local_70);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getLocalFromIdx(uint32_t idx) {
    if (!func) {
      return in.err("cannot access locals outside of a function");
    }
    if (idx >= func->getNumLocals()) {
      return in.err("local index out of bounds");
    }
    return idx;
  }